

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O2

char * yyqq(char *s)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  byte *__s;
  
  bVar6 = *s;
  lVar4 = 0;
  uVar7 = (ulong)bVar6;
  iVar2 = 0;
  while ((char)uVar7 != '\0') {
    bVar1 = s[lVar4 + 1];
    uVar7 = (ulong)bVar1;
    if (uVar7 < 0x26) {
      if ((0x2408003b80U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00104c04;
      if (uVar7 != 10) goto LAB_00104c17;
      iVar2 = iVar2 + 4;
    }
    else {
LAB_00104c17:
      if (bVar1 == 0x5c) {
LAB_00104c04:
        iVar2 = iVar2 + 2;
      }
      else {
        iVar2 = iVar2 + (uint)((char)bVar1 < ' ') * 4 + 1;
      }
    }
    lVar4 = lVar4 + 1;
  }
  if ((int)lVar4 != iVar2) {
    pbVar3 = (byte *)malloc((long)(iVar2 + 1));
    pbVar5 = (byte *)(s + 1);
    __s = pbVar3;
    while (bVar6 != 0) {
      switch(bVar6) {
      case 7:
        __s[0] = 0x5c;
        __s[1] = 0x61;
        break;
      case 8:
        __s[0] = 0x5c;
        __s[1] = 0x62;
        break;
      case 9:
        __s[0] = 0x5c;
        __s[1] = 0x74;
        break;
      case 10:
        __s[0] = 0x5c;
        __s[1] = 0x6e;
        __s[2] = 0x5c;
        __s[3] = 10;
LAB_00104d15:
        __s = __s + 4;
        goto LAB_00104cf3;
      case 0xb:
        __s[0] = 0x5c;
        __s[1] = 0x76;
        break;
      case 0xc:
        __s[0] = 0x5c;
        __s[1] = 0x66;
        break;
      case 0xd:
        __s[0] = 0x5c;
        __s[1] = 0x72;
        break;
      default:
        if (bVar6 == 0x1b) {
          __s[0] = 0x5c;
          __s[1] = 0x65;
        }
        else if (bVar6 == 0x5c) {
          __s[0] = 0x5c;
          __s[1] = 0x5c;
        }
        else if (bVar6 == 0x25) {
          __s[0] = 0x25;
          __s[1] = 0x25;
        }
        else {
          if (bVar6 != 0x22) {
            if ((char)bVar6 < ' ') {
              sprintf((char *)__s,"\\%03o",(ulong)(uint)(int)(char)bVar6);
              goto LAB_00104d15;
            }
            *__s = bVar6;
            __s = __s + 1;
            goto LAB_00104cf3;
          }
          __s[0] = 0x5c;
          __s[1] = 0x22;
        }
      }
      __s = __s + 2;
LAB_00104cf3:
      bVar6 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    }
    *__s = 0;
    s = (char *)pbVar3;
  }
  return (char *)(byte *)s;
}

Assistant:

static char *yyqq(char* s) {
  char *d = s;
  char *dst;
  int sl = 0, dl = 0;
  while (*s++) {
    dl++; sl++;
    if (*s==7||*s==8||*s==9||*s==11||*s==12||*s==13||*s==27||*s==34||*s=='%'||*s==92) { dl++; } /* escape with '\' */
    else if (*s==10) { dl += 3; }        /* \n\^J */
    else if (*(signed char*)s<32) { dl += 4; } /* octal \000 */
  }
  if (dl == sl) return d;
  s = d;
  dst = d = (char *)malloc(dl+1);
  while (*s) {
    if (*s == '"') {
      *d++ = '\\'; *d++ = *s++;
    } else if (*s == '%') { /* '%' in printf */
      *d++ = '%'; *d++ = *s++;
    } else if (*s == '\n') { /* \n\^J */
      *d++ = '\\'; *d++ = 'n'; *d++ = '\\'; *d++ = 10; s++;
    } else if (*s == '\t') { /* ht */
      *d++ = '\\'; *d++ = 't'; s++;
    } else if (*s == '\r') { /*cr */
      *d++ = '\\'; *d++ = 'r'; s++;
    } else if (*s == '\a') { /*bel*/
      *d++ = '\\'; *d++ = 'a'; s++;
    } else if (*s == '\b') { /*bs*/
      *d++ = '\\'; *d++ = 'b'; s++;
    } else if (*s == '\e') { /*esc*/
      *d++ = '\\'; *d++ = 'e'; s++;
    } else if (*s == '\f') { /*ff*/
      *d++ = '\\'; *d++ = 'f'; s++;
    } else if (*s == '\v') { /*vt*/
      *d++ = '\\'; *d++ = 'v'; s++;
    } else if (*s == 92) { /* '\' */
      *d++ = '\\'; *d++ = *s++;
    } else if (*(signed char*)s<32) {
      sprintf(d,"\\%03o", *s); /* octal \000 */
      d += 4; s++;
    } else {
      *d++ = *s++;
    }
  }
  *d = 0;
  return dst;
}